

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.c
# Opt level: O0

void MD5Final(uchar *digest,MD5_CTX *ctx)

{
  long lVar1;
  int local_2c;
  ulong uStack_28;
  int i;
  size_t padlen;
  uint8_t count [8];
  MD5_CTX *ctx_local;
  uchar *digest_local;
  
  padlen._7_1_ = (undefined1)(ctx->count >> 0x38);
  padlen._6_1_ = (undefined1)(ctx->count >> 0x30);
  padlen._5_1_ = (undefined1)(ctx->count >> 0x28);
  padlen._4_1_ = (undefined1)(ctx->count >> 0x20);
  padlen._3_1_ = (undefined1)(ctx->count >> 0x18);
  padlen._2_1_ = (undefined1)(ctx->count >> 0x10);
  padlen._1_1_ = (undefined1)(ctx->count >> 8);
  padlen._0_1_ = (undefined1)ctx->count;
  lVar1 = -(ctx->count >> 3 & 0x3f);
  uStack_28 = lVar1 + 0x40;
  if (uStack_28 < 9) {
    uStack_28 = lVar1 + 0x80;
  }
  count = (uint8_t  [8])ctx;
  MD5Update(ctx,PADDING,uStack_28 - 8);
  MD5Update((MD5_CTX *)count,&padlen,8);
  for (local_2c = 0; local_2c < 4; local_2c = local_2c + 1) {
    digest[(long)(local_2c << 2) + 3] =
         (uchar)((uint)*(undefined4 *)((long)count + (long)local_2c * 4) >> 0x18);
    digest[(long)(local_2c << 2) + 2] =
         (uchar)((uint)*(undefined4 *)((long)count + (long)local_2c * 4) >> 0x10);
    digest[(long)(local_2c << 2) + 1] =
         (uchar)((uint)*(undefined4 *)((long)count + (long)local_2c * 4) >> 8);
    digest[local_2c << 2] = (uchar)*(undefined4 *)((long)count + (long)local_2c * 4);
  }
  memset((void *)count,0,0x58);
  return;
}

Assistant:

void MD5Final(unsigned char digest[MD5_DIGEST_LENGTH], MD5_CTX *ctx)
{
	uint8_t count[8];
	size_t padlen;
	int i;

	/* Convert count to 8 bytes in little endian order. */
	PUT_64BIT_LE(count, ctx->count);

	/* Pad out to 56 mod 64. */
	padlen =
		MD5_BLOCK_LENGTH - ((ctx->count >> 3) & (MD5_BLOCK_LENGTH - 1));
	if (padlen < 1 + 8)
		padlen += MD5_BLOCK_LENGTH;
	MD5Update(ctx, PADDING, padlen - 8); /* padlen - 8 <= 64 */
	MD5Update(ctx, count, 8);

	for (i = 0; i < 4; i++)
		PUT_32BIT_LE(digest + i * 4, ctx->state[i]);
	memset(ctx, 0, sizeof(*ctx)); /* in case it's sensitive */
}